

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_test.cpp
# Opt level: O2

void __thiscall Filter_Integral_Test::Filter_Integral_Test(Filter_Integral_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_03138f18;
  return;
}

Assistant:

TEST(Filter, Integral) {
    auto approxEqual = [](Float a, Float b) {
        if (std::max(std::abs(a), std::abs(b)) < 1e-3)
            return std::abs(a - b) < 1e-5;
        else
            return 2 * std::abs(a - b) / std::abs(a + b) < 1e-2;
    };
    auto makeFilters = [](const Vector2f &radius) -> std::vector<FilterHandle> {
        return {new BoxFilter(radius), new GaussianFilter(radius),
                new MitchellFilter(radius), new LanczosSincFilter(radius),
                new TriangleFilter(radius)};
    };

    for (FilterHandle f : makeFilters(Vector2f(1, 1)))
        EXPECT_TRUE(approxEqual(f.Integral(), integrateFilter(f))) << f;

    for (FilterHandle f : makeFilters(Vector2f(2.5, 1)))
        EXPECT_TRUE(approxEqual(f.Integral(), integrateFilter(f))) << f;

    for (FilterHandle f : makeFilters(Vector2f(1, 2.5)))
        EXPECT_TRUE(approxEqual(f.Integral(), integrateFilter(f))) << f;

    for (FilterHandle f : makeFilters(Vector2f(3.4, 2.5)))
        EXPECT_TRUE(approxEqual(f.Integral(), integrateFilter(f))) << f;
}